

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

void __thiscall
Lib::
Map<Kernel::Variable,_Lib::Coproduct<Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::StlHash>
::clear(Map<Kernel::Variable,_Lib::Coproduct<Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RealConstantType>_>_>,_Lib::StlHash>
        *this)

{
  Entry *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  if (*(long *)&in_RDI->_value != 0) {
    array_delete<Lib::Map<Kernel::Variable,Lib::Coproduct<Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RealConstantType>>>,Lib::StlHash>::Entry>
              (in_RDI,in_stack_ffffffffffffffe8);
    Lib::free(*(void **)&in_RDI->_value);
  }
  in_RDI->code = 0;
  in_RDI->_key = (MaybeUninit<Kernel::Variable>)0x0;
  *(undefined8 *)&in_RDI->_value = 0;
  *(undefined8 *)((long)&in_RDI->_value + 8) = 0;
  *(undefined4 *)((long)&in_RDI->_value + 0x10) = 0;
  return;
}

Assistant:

void clear()
  {
    if (_entries) {
      array_delete(_entries, _capacity);
      DEALLOC_KNOWN(_entries,sizeof(Entry)*_capacity,"Map<>");
    }
    _capacity    = 0;
    _noOfEntries = 0;
    _entries     = nullptr;
    _afterLast   = nullptr;
    _maxEntries  = 0;
  }